

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

int getSurfaceHeight(double *ncol00,double *ncol01,double *ncol10,double *ncol11,int colymin,
                    int colymax,int blockspercell,double dx,double dz)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar4 = (long)colymax;
  iVar5 = colymax * blockspercell;
  do {
    if (lVar4 <= colymin) {
      return 0;
    }
    lVar4 = lVar4 + -1;
    lVar2 = lVar4 - colymin;
    iVar3 = blockspercell;
    iVar1 = iVar5;
    while (0 < iVar3) {
      iVar3 = iVar3 + -1;
      dVar6 = (double)iVar3 / (double)blockspercell;
      dVar7 = dVar6 * (ncol01[lVar2 + 1] - ncol01[lVar2]) + ncol01[lVar2];
      dVar8 = dVar6 * (ncol00[lVar2 + 1] - ncol00[lVar2]) + ncol00[lVar2];
      dVar8 = ((dVar6 * (ncol10[lVar2 + 1] - ncol10[lVar2]) + ncol10[lVar2]) - dVar8) * dx + dVar8;
      iVar1 = iVar1 + -1;
      if (0.0 < ((((dVar6 * (ncol11[lVar2 + 1] - ncol11[lVar2]) + ncol11[lVar2]) - dVar7) * dx +
                 dVar7) - dVar8) * dz + dVar8) {
        return iVar1;
      }
    }
    iVar5 = iVar5 - blockspercell;
  } while( true );
}

Assistant:

int getSurfaceHeight(
        const double ncol00[], const double ncol01[],
        const double ncol10[], const double ncol11[],
        int colymin, int colymax, int blockspercell, double dx, double dz)
{
    int y, celly;
    for (celly = colymax-1; celly >= colymin; celly--)
    {
        int idx = celly - colymin;
        double v000 = ncol00[idx];
        double v001 = ncol01[idx];
        double v100 = ncol10[idx];
        double v101 = ncol11[idx];
        double v010 = ncol00[idx+1];
        double v011 = ncol01[idx+1];
        double v110 = ncol10[idx+1];
        double v111 = ncol11[idx+1];

        for (y = blockspercell - 1; y >= 0; y--)
        {
            double dy = y / (double) blockspercell;
            double noise = lerp3(dy, dx, dz, // Note: not x, y, z
                v000, v010, v100, v110,
                v001, v011, v101, v111);
            if (noise > 0)
                return celly * blockspercell + y;
        }
    }
    return 0;
}